

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnSegment::MarkAsPersistent
          (ColumnSegment *this,shared_ptr<duckdb::BlockHandle,_true> *block_p,uint32_t offset_p)

{
  BlockHandle *pBVar1;
  
  this->segment_type = PERSISTENT;
  pBVar1 = shared_ptr<duckdb::BlockHandle,_true>::operator->(block_p);
  this->block_id = pBVar1->block_id;
  this->offset = (ulong)offset_p;
  shared_ptr<duckdb::BlockHandle,_true>::operator=(&this->block,block_p);
  return;
}

Assistant:

void ColumnSegment::MarkAsPersistent(shared_ptr<BlockHandle> block_p, uint32_t offset_p) {
	D_ASSERT(segment_type == ColumnSegmentType::TRANSIENT);
	segment_type = ColumnSegmentType::PERSISTENT;

	block_id = block_p->BlockId();
	offset = offset_p;
	block = std::move(block_p);
}